

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O2

quaternion * quaternion_lerp(quaternion *start,quaternion *end,float percent,quaternion *qR)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  long lStack_8;
  
  fVar1 = -percent;
  if (-percent <= percent) {
    fVar1 = percent;
  }
  if (fVar1 < 1e-05) {
    fVar1 = (start->field_0).q[2];
    fVar2 = (start->field_0).q[3];
    uVar3 = *(undefined8 *)&start->field_0;
  }
  else {
    fVar2 = percent + -1.0;
    fVar1 = -fVar2;
    if (-fVar2 <= fVar2) {
      fVar1 = fVar2;
    }
    if (1e-05 <= fVar1) {
      fVar1 = 1.0 - percent;
      (qR->field_0).q[3] = (start->field_0).q[3] * fVar1 + (end->field_0).q[3] * percent;
      (qR->field_0).q[0] = (start->field_0).q[0] * fVar1 + (end->field_0).q[0] * percent;
      (qR->field_0).q[1] = (start->field_0).q[1] * fVar1 + (end->field_0).q[1] * percent;
      fVar2 = fVar1 * (start->field_0).q[2] + percent * (end->field_0).q[2];
      lStack_8 = 8;
      goto LAB_0010b6a2;
    }
    fVar1 = (end->field_0).q[2];
    fVar2 = (end->field_0).q[3];
    uVar3 = *(undefined8 *)&end->field_0;
  }
  *(undefined8 *)&qR->field_0 = uVar3;
  (qR->field_0).q[2] = fVar1;
  lStack_8 = 0xc;
LAB_0010b6a2:
  *(float *)((long)&qR->field_0 + lStack_8) = fVar2;
  return qR;
}

Assistant:

HYPAPI struct quaternion *quaternion_lerp(const struct quaternion *start, const struct quaternion *end, HYP_FLOAT percent, struct quaternion *qR)
{
	HYP_FLOAT f1, f2;

	/* if percent is 0, return start */
	if (scalar_equalsf(percent, 0.0f)) {
		quaternion_set(qR, start);
		return qR;
	}

	/* if percent is 1 return end */
	if (scalar_equalsf(percent, 1.0f)) {
		quaternion_set(qR, end);
		return qR;
	}

	f1 = 1.0f - percent;
	f2 = percent;

	/* this expanded form avoids calling quaternion_multiply and
	 * quaternion_add
	 */
	qR->w = f1 * start->w + f2 * end->w;
	qR->x = f1 * start->x + f2 * end->x;
	qR->y = f1 * start->y + f2 * end->y;
	qR->z = f1 * start->z + f2 * end->z;

	return qR;
}